

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void CreateSystem(ecs_iter_t *it)

{
  ecs_world_t *world_00;
  ecs_entity_t *peVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  void *local_50;
  void *ctx_ptr;
  ecs_entity_t e;
  int32_t i;
  EcsContext *ctx;
  EcsIterAction *action;
  EcsQuery *query;
  ecs_entity_t *entities;
  ecs_world_t *world;
  ecs_iter_t *it_local;
  
  world_00 = it->world;
  peVar1 = it->entities;
  pvVar2 = ecs_column_w_size(it,8,1);
  pvVar3 = ecs_column_w_size(it,8,2);
  pvVar4 = ecs_column_w_size(it,8,3);
  for (e._4_4_ = 0; e._4_4_ < it->count; e._4_4_ = e._4_4_ + 1) {
    local_50 = (void *)0x0;
    if (pvVar4 != (void *)0x0) {
      local_50 = *(void **)((long)pvVar4 + (long)e._4_4_ * 8);
    }
    ecs_init_system(world_00,peVar1[e._4_4_],
                    *(ecs_iter_action_t *)((long)pvVar3 + (long)e._4_4_ * 8),
                    *(ecs_query_t **)((long)pvVar2 + (long)e._4_4_ * 8),local_50);
  }
  return;
}

Assistant:

static
void CreateSystem(
    ecs_iter_t *it)
{
    ecs_world_t *world = it->world;
    ecs_entity_t *entities = it->entities;

    EcsQuery *query = ecs_column(it, EcsQuery, 1);
    EcsIterAction *action = ecs_column(it, EcsIterAction, 2);
    EcsContext *ctx = ecs_column(it, EcsContext, 3);
    
    int32_t i;
    for (i = 0; i < it->count; i ++) {
        ecs_entity_t e = entities[i];
        void *ctx_ptr = NULL;
        if (ctx) {
            ctx_ptr = (void*)ctx[i].ctx;
        }

        ecs_init_system(world, e, action[i].action, query[i].query, ctx_ptr);
    }
}